

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O3

CURLcode Curl_add_custom_headers(connectdata *conn,_Bool is_connect,Curl_send_buffer *req_buffer)

{
  Curl_easy *pCVar1;
  char *first;
  Curl_send_buffer *pCVar2;
  byte *pbVar3;
  byte *pbVar4;
  int iVar5;
  Curl_HttpReq CVar6;
  CURLcode CVar7;
  byte *pbVar8;
  char *pcVar9;
  byte *pbVar10;
  undefined7 in_register_00000031;
  curl_slist *pcVar11;
  byte *pbVar12;
  char *second;
  bool bVar13;
  curl_slist *h [2];
  long local_58;
  Curl_send_buffer *local_50;
  curl_slist *local_48 [2];
  long local_38;
  
  pCVar1 = conn->data;
  if ((int)CONCAT71(in_register_00000031,is_connect) == 0) {
    local_48[0] = (pCVar1->set).headers;
    local_58 = 1;
    if (((*(uint *)&(conn->bits).field_0x4 & 0x4020) == 0x20) &&
       (((pCVar1->set).field_0x878 & 0x10) != 0)) {
      local_48[1] = (pCVar1->set).proxyheaders;
      local_58 = 2;
    }
  }
  else {
    if (((pCVar1->set).field_0x878 & 0x10) == 0) {
      local_48[0] = (pCVar1->set).headers;
    }
    else {
      local_48[0] = (pCVar1->set).proxyheaders;
    }
    local_58 = 1;
  }
  local_38 = 0;
  local_50 = req_buffer;
  do {
    for (pcVar11 = local_48[local_38]; pcVar11 != (curl_slist *)0x0; pcVar11 = pcVar11->next) {
      pcVar9 = pcVar11->data;
      pbVar8 = (byte *)strchr(pcVar9,0x3a);
      if (pbVar8 == (byte *)0x0) {
        pbVar8 = (byte *)strchr(pcVar9,0x3b);
        pbVar3 = pbVar8;
        pbVar4 = pbVar8;
        if (pbVar8 != (byte *)0x0) {
          do {
            pbVar12 = pbVar4;
            pbVar10 = pbVar3;
            if (pbVar12[1] == 0) goto LAB_004e233f;
            iVar5 = Curl_isspace((uint)pbVar12[1]);
            pbVar3 = pbVar10 + 1;
            pbVar4 = pbVar12 + 1;
          } while (iVar5 != 0);
          if (pbVar12[1] == 0) {
LAB_004e233f:
            if (*pbVar12 != 0x3b) goto LAB_004e21b1;
            pcVar9 = (*Curl_cstrdup)(pcVar11->data);
            pCVar2 = local_50;
            if (pcVar9 == (char *)0x0) {
              if (local_50 != (Curl_send_buffer *)0x0) {
                (*Curl_cfree)(local_50->buffer);
              }
              (*Curl_cfree)(pCVar2);
              return CURLE_OUT_OF_MEMORY;
            }
            pbVar10[(long)pcVar9 - (long)pcVar11->data] = 0x3a;
            pbVar8 = pbVar10 + ((long)pcVar9 - (long)pcVar11->data);
            goto LAB_004e21b7;
          }
        }
      }
      else {
LAB_004e21b1:
        pcVar9 = (char *)0x0;
LAB_004e21b7:
        do {
          pbVar8 = pbVar8 + 1;
          if (*pbVar8 == 0) {
            bVar13 = false;
            goto LAB_004e21d7;
          }
          iVar5 = Curl_isspace((uint)*pbVar8);
        } while (iVar5 != 0);
        bVar13 = *pbVar8 != 0;
LAB_004e21d7:
        if ((pcVar9 != (char *)0x0) || (bVar13)) {
          second = pcVar9;
          if (pcVar9 == (char *)0x0) {
            second = pcVar11->data;
          }
          if (((conn->allocptr).host == (char *)0x0) ||
             (iVar5 = curl_strnequal("Host:",second,5), iVar5 == 0)) {
            CVar6 = (pCVar1->set).httpreq;
            if (CVar6 == HTTPREQ_POST_FORM) {
              iVar5 = curl_strnequal("Content-Type:",second,0xd);
              if (iVar5 != 0) goto LAB_004e22d6;
              CVar6 = (pCVar1->set).httpreq;
            }
            if (((((CVar6 == HTTPREQ_POST_MIME) &&
                  (iVar5 = curl_strnequal("Content-Type:",second,0xd), iVar5 != 0)) ||
                 ((((conn->bits).field_0x5 & 0x80) != 0 &&
                  (iVar5 = curl_strnequal("Content-Length:",second,0xf), iVar5 != 0)))) ||
                ((((conn->allocptr).te != (char *)0x0 &&
                  (iVar5 = curl_strnequal("Connection:",second,0xb), iVar5 != 0)) ||
                 ((conn->httpversion == 0x14 &&
                  (iVar5 = curl_strnequal("Transfer-Encoding:",second,0x12), iVar5 != 0)))))) ||
               ((((iVar5 = curl_strnequal("Authorization:",second,0xe), iVar5 != 0 ||
                  (iVar5 = curl_strnequal("Cookie:",second,7), iVar5 != 0)) &&
                 (((pCVar1->state).field_0x4e4 & 2) != 0)) &&
                (((first = (pCVar1->state).first_host, first != (char *)0x0 &&
                  (((pCVar1->set).field_0x87b & 1) == 0)) &&
                 (iVar5 = Curl_strcasecompare(first,(conn->host).name), iVar5 == 0))))))
            goto LAB_004e22d6;
            CVar7 = Curl_add_bufferf(&local_50,"%s\r\n",second);
          }
          else {
LAB_004e22d6:
            CVar7 = CURLE_OK;
          }
          if (pcVar9 != (char *)0x0) {
            (*Curl_cfree)(pcVar9);
          }
          if (CVar7 != CURLE_OK) {
            return CVar7;
          }
        }
      }
    }
    local_38 = local_38 + 1;
    if (local_38 == local_58) {
      return CURLE_OK;
    }
  } while( true );
}

Assistant:

CURLcode Curl_add_custom_headers(struct connectdata *conn,
                                 bool is_connect,
                                 Curl_send_buffer *req_buffer)
{
  char *ptr;
  struct curl_slist *h[2];
  struct curl_slist *headers;
  int numlists = 1; /* by default */
  struct Curl_easy *data = conn->data;
  int i;

  enum proxy_use proxy;

  if(is_connect)
    proxy = HEADER_CONNECT;
  else
    proxy = conn->bits.httpproxy && !conn->bits.tunnel_proxy?
      HEADER_PROXY:HEADER_SERVER;

  switch(proxy) {
  case HEADER_SERVER:
    h[0] = data->set.headers;
    break;
  case HEADER_PROXY:
    h[0] = data->set.headers;
    if(data->set.sep_headers) {
      h[1] = data->set.proxyheaders;
      numlists++;
    }
    break;
  case HEADER_CONNECT:
    if(data->set.sep_headers)
      h[0] = data->set.proxyheaders;
    else
      h[0] = data->set.headers;
    break;
  }

  /* loop through one or two lists */
  for(i = 0; i < numlists; i++) {
    headers = h[i];

    while(headers) {
      char *semicolonp = NULL;
      ptr = strchr(headers->data, ':');
      if(!ptr) {
        char *optr;
        /* no colon, semicolon? */
        ptr = strchr(headers->data, ';');
        if(ptr) {
          optr = ptr;
          ptr++; /* pass the semicolon */
          while(*ptr && ISSPACE(*ptr))
            ptr++;

          if(*ptr) {
            /* this may be used for something else in the future */
            optr = NULL;
          }
          else {
            if(*(--ptr) == ';') {
              /* copy the source */
              semicolonp = strdup(headers->data);
              if(!semicolonp) {
                Curl_add_buffer_free(&req_buffer);
                return CURLE_OUT_OF_MEMORY;
              }
              /* put a colon where the semicolon is */
              semicolonp[ptr - headers->data] = ':';
              /* point at the colon */
              optr = &semicolonp [ptr - headers->data];
            }
          }
          ptr = optr;
        }
      }
      if(ptr) {
        /* we require a colon for this to be a true header */

        ptr++; /* pass the colon */
        while(*ptr && ISSPACE(*ptr))
          ptr++;

        if(*ptr || semicolonp) {
          /* only send this if the contents was non-blank or done special */
          CURLcode result = CURLE_OK;
          char *compare = semicolonp ? semicolonp : headers->data;

          if(conn->allocptr.host &&
             /* a Host: header was sent already, don't pass on any custom Host:
                header as that will produce *two* in the same request! */
             checkprefix("Host:", compare))
            ;
          else if(data->set.httpreq == HTTPREQ_POST_FORM &&
                  /* this header (extended by formdata.c) is sent later */
                  checkprefix("Content-Type:", compare))
            ;
          else if(data->set.httpreq == HTTPREQ_POST_MIME &&
                  /* this header is sent later */
                  checkprefix("Content-Type:", compare))
            ;
          else if(conn->bits.authneg &&
                  /* while doing auth neg, don't allow the custom length since
                     we will force length zero then */
                  checkprefix("Content-Length:", compare))
            ;
          else if(conn->allocptr.te &&
                  /* when asking for Transfer-Encoding, don't pass on a custom
                     Connection: */
                  checkprefix("Connection:", compare))
            ;
          else if((conn->httpversion == 20) &&
                  checkprefix("Transfer-Encoding:", compare))
            /* HTTP/2 doesn't support chunked requests */
            ;
          else if((checkprefix("Authorization:", compare) ||
                   checkprefix("Cookie:", compare)) &&
                  /* be careful of sending this potentially sensitive header to
                     other hosts */
                  (data->state.this_is_a_follow &&
                   data->state.first_host &&
                   !data->set.allow_auth_to_other_hosts &&
                   !strcasecompare(data->state.first_host, conn->host.name)))
            ;
          else {
            result = Curl_add_bufferf(&req_buffer, "%s\r\n", compare);
          }
          if(semicolonp)
            free(semicolonp);
          if(result)
            return result;
        }
      }
      headers = headers->next;
    }
  }

  return CURLE_OK;
}